

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  anon_class_24_3_c2b06966 fn;
  uint uVar1;
  undefined4 in_register_00000034;
  size_t *in_stack_ffffffffffffffb0;
  void *local_28;
  size_t size_local;
  char *ptr_local;
  SocketStream *this_local;
  
  size_local = CONCAT44(in_register_00000034,__fd);
  local_28 = __buf;
  ptr_local = (char *)this;
  uVar1 = (*(this->super_Stream)._vptr_Stream[2])();
  if ((uVar1 & 1) == 0) {
    this_local = (SocketStream *)0xffffffffffffffff;
  }
  else {
    fn.ptr = (char **)&local_28;
    fn.this = (SocketStream *)&size_local;
    fn.size = in_stack_ffffffffffffffb0;
    this_local = (SocketStream *)
                 handle_EINTR<httplib::detail::SocketStream::read(char*,unsigned_long)::_lambda()_1_>
                           (fn);
  }
  return (ssize_t)this_local;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
			if (!is_readable()) { return -1; }

#ifdef _WIN32
			if (size > static_cast<size_t>((std::numeric_limits<int>::max)())) {
    return -1;
  }
  return recv(sock_, ptr, static_cast<int>(size), CPPHTTPLIB_RECV_FLAGS);
#else
			return handle_EINTR(
					[&]() { return recv(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS); });
#endif
		}